

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,BlockStatement *stmt)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  StatementBlockSymbol *pSVar3;
  Statement *this_00;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  value_type *elements;
  ulong pos0;
  long lVar9;
  DataFlowState *pDVar10;
  EVP_PKEY_CTX *this_01;
  ulong hash;
  ulong uVar11;
  StatementSyntax *pSVar12;
  DataFlowState *branchState;
  ulong uVar13;
  pointer other;
  uint uVar14;
  Statement **ppSVar15;
  BlockStatement *pBVar16;
  long lVar17;
  ulong uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  iterator pos;
  try_emplace_args_t local_399;
  BlockStatement *local_398;
  DataFlowState *local_390;
  Statement *stmtPtr;
  long local_380;
  uchar local_378;
  uchar uStack_377;
  uchar uStack_376;
  byte bStack_375;
  uchar uStack_374;
  uchar uStack_373;
  uchar uStack_372;
  byte bStack_371;
  uchar uStack_370;
  uchar uStack_36f;
  uchar uStack_36e;
  byte bStack_36d;
  uchar uStack_36c;
  uchar uStack_36b;
  uchar uStack_36a;
  byte bStack_369;
  type finalState;
  DataFlowState currState;
  DataFlowState local_170;
  DataFlowState local_d0;
  
  pSVar3 = stmt->blockSymbol;
  local_398 = stmt;
  if (pSVar3 != (StatementBlockSymbol *)0x0) {
    this_01 = (EVP_PKEY_CTX *)&this->disableBranches;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .data_ = (pointer)currState.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      firstElement;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .len = 0;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .cap = 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pSVar3;
    hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->disableBranches).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar13 = (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .arrays.groups_size_mask;
    uVar11 = 0;
    uVar18 = pos0;
    do {
      pgVar4 = (this->disableBranches).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
               .arrays.groups_ + uVar18;
      local_378 = pgVar4->m[0].n;
      uStack_377 = pgVar4->m[1].n;
      uStack_376 = pgVar4->m[2].n;
      bStack_375 = pgVar4->m[3].n;
      uStack_374 = pgVar4->m[4].n;
      uStack_373 = pgVar4->m[5].n;
      uStack_372 = pgVar4->m[6].n;
      bStack_371 = pgVar4->m[7].n;
      uStack_370 = pgVar4->m[8].n;
      uStack_36f = pgVar4->m[9].n;
      uStack_36e = pgVar4->m[10].n;
      bStack_36d = pgVar4->m[0xb].n;
      uStack_36c = pgVar4->m[0xc].n;
      uStack_36b = pgVar4->m[0xd].n;
      uStack_36a = pgVar4->m[0xe].n;
      bStack_369 = pgVar4->m[0xf].n;
      uVar19 = (uchar)uVar2;
      auVar24[0] = -(local_378 == uVar19);
      uVar20 = (uchar)((uint)uVar2 >> 8);
      auVar24[1] = -(uStack_377 == uVar20);
      uVar21 = (uchar)((uint)uVar2 >> 0x10);
      auVar24[2] = -(uStack_376 == uVar21);
      bVar22 = (byte)((uint)uVar2 >> 0x18);
      auVar24[3] = -(bStack_375 == bVar22);
      auVar24[4] = -(uStack_374 == uVar19);
      auVar24[5] = -(uStack_373 == uVar20);
      auVar24[6] = -(uStack_372 == uVar21);
      auVar24[7] = -(bStack_371 == bVar22);
      auVar24[8] = -(uStack_370 == uVar19);
      auVar24[9] = -(uStack_36f == uVar20);
      auVar24[10] = -(uStack_36e == uVar21);
      auVar24[0xb] = -(bStack_36d == bVar22);
      auVar24[0xc] = -(uStack_36c == uVar19);
      auVar24[0xd] = -(uStack_36b == uVar20);
      auVar24[0xe] = -(uStack_36a == uVar21);
      auVar24[0xf] = -(bStack_369 == bVar22);
      for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
          stmtPtr = (Statement *)pSVar3, uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
        uVar6 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        if (pSVar3 == (StatementBlockSymbol *)
                      (this->disableBranches).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                      .arrays.elements_[uVar18 * 0xf + (ulong)uVar6].first) goto LAB_0051109c;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_369) == 0) break;
      lVar17 = uVar18 + uVar11;
      uVar11 = uVar11 + 1;
      uVar18 = lVar17 + 1U & uVar13;
    } while (uVar11 <= uVar13);
    if ((this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.size <
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                ((locator *)&finalState,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                  *)this_01,pos0,hash,&local_399,(Symbol **)&stmtPtr,
                 (SmallVector<slang::analysis::DataFlowState,_2UL> *)&currState);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                ((locator *)&finalState,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                  *)this_01,hash,&local_399,(Symbol **)&stmtPtr,
                 (SmallVector<slang::analysis::DataFlowState,_2UL> *)&currState);
    }
LAB_0051109c:
    SmallVectorBase<slang::analysis::DataFlowState>::cleanup
              ((SmallVectorBase<slang::analysis::DataFlowState> *)&currState,this_01);
  }
  pBVar16 = local_398;
  if (local_398->blockKind == Sequential) {
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              (local_398->body,(DataFlowAnalysis *)this);
  }
  else {
    stmtPtr = local_398->body;
    if (stmtPtr->kind == List) {
      ppSVar15 = *(Statement ***)(stmtPtr + 1);
      pSVar12 = stmtPtr[1].syntax;
    }
    else {
      ppSVar15 = &stmtPtr;
      pSVar12 = (StatementSyntax *)0x1;
    }
    lVar17 = (long)pSVar12 * 8;
    uVar13 = 0;
    while ((uVar18 = (ulong)pSVar12 & 0x1fffffffffffffff, lVar17 != 0 &&
           (uVar18 = uVar13, ppSVar15[uVar13]->kind == VariableDeclaration))) {
      ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
                (ppSVar15[uVar13],(DataFlowAnalysis *)this);
      uVar13 = uVar13 + 1;
      lVar17 = lVar17 + -8;
    }
    local_380 = (long)pSVar12 - uVar18;
    pDVar10 = &this->state;
    DataFlowAnalysis::copyState(&currState,(DataFlowAnalysis *)this,pDVar10);
    local_390 = pDVar10;
    DataFlowState::DataFlowState(&finalState,pDVar10);
    for (lVar17 = uVar18 << 3; (long)pSVar12 * 8 != lVar17; lVar17 = lVar17 + 8) {
      this_00 = *(Statement **)((long)ppSVar15 + lVar17);
      DataFlowAnalysis::copyState(&local_d0,(DataFlowAnalysis *)this,&currState);
      pDVar10 = &local_d0;
      setState(this,&local_d0);
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                 &local_d0,(EVP_PKEY_CTX *)pDVar10);
      ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(this_00,(DataFlowAnalysis *)this);
      if (local_398->blockKind == JoinAll) {
LAB_005111bc:
        DataFlowAnalysis::meetState((DataFlowAnalysis *)this,&finalState,local_390);
      }
      else if (local_398->blockKind == JoinAny) {
        if (local_380 == 1) goto LAB_005111bc;
        DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&finalState,local_390);
      }
    }
    pDVar10 = &local_170;
    DataFlowState::DataFlowState(pDVar10,&finalState);
    setState(this,pDVar10);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_170
               ,(EVP_PKEY_CTX *)pDVar10);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
               &finalState,(EVP_PKEY_CTX *)pDVar10);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&currState
               ,(EVP_PKEY_CTX *)pDVar10);
    pBVar16 = local_398;
  }
  pSVar3 = pBVar16->blockSymbol;
  if (pSVar3 == (StatementBlockSymbol *)0x0) {
    return;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = pSVar3;
  uVar13 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar18 = uVar13 >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  local_398 = (BlockStatement *)&this->disableBranches;
  pgVar4 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar13 & 0xff];
  ppVar5 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
           .arrays.elements_;
  lVar17 = 0;
  do {
    pgVar1 = pgVar4 + uVar18;
    uVar19 = (uchar)uVar2;
    auVar25[0] = -(pgVar1->m[0].n == uVar19);
    uVar20 = (uchar)((uint)uVar2 >> 8);
    auVar25[1] = -(pgVar1->m[1].n == uVar20);
    uVar21 = (uchar)((uint)uVar2 >> 0x10);
    auVar25[2] = -(pgVar1->m[2].n == uVar21);
    uVar23 = (uchar)((uint)uVar2 >> 0x18);
    auVar25[3] = -(pgVar1->m[3].n == uVar23);
    auVar25[4] = -(pgVar1->m[4].n == uVar19);
    auVar25[5] = -(pgVar1->m[5].n == uVar20);
    auVar25[6] = -(pgVar1->m[6].n == uVar21);
    auVar25[7] = -(pgVar1->m[7].n == uVar23);
    auVar25[8] = -(pgVar1->m[8].n == uVar19);
    auVar25[9] = -(pgVar1->m[9].n == uVar20);
    auVar25[10] = -(pgVar1->m[10].n == uVar21);
    auVar25[0xb] = -(pgVar1->m[0xb].n == uVar23);
    auVar25[0xc] = -(pgVar1->m[0xc].n == uVar19);
    auVar25[0xd] = -(pgVar1->m[0xd].n == uVar20);
    auVar25[0xe] = -(pgVar1->m[0xe].n == uVar21);
    auVar25[0xf] = -(pgVar1->m[0xf].n == uVar23);
    for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe); uVar14 != 0;
        uVar14 = uVar14 - 1 & uVar14) {
      uVar6 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      local_390 = (DataFlowState *)(ulong)uVar6;
      if (pSVar3 == (StatementBlockSymbol *)ppVar5[uVar18 * 0xf + (long)local_390].first) {
        other = ppVar5[uVar18 * 0xf + (long)local_390].second.
                super_SmallVectorBase<slang::analysis::DataFlowState>.data_;
        for (lVar17 = ppVar5[uVar18 * 0xf + (long)local_390].second.
                      super_SmallVectorBase<slang::analysis::DataFlowState>.len * 0xa0; lVar17 != 0;
            lVar17 = lVar17 + -0xa0) {
          DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&this->state,other);
          other = other + 1;
        }
        pos.p_ = (table_element_pointer)(pgVar4[uVar18].m + (long)local_390);
        pos.pc_ = (char_pointer)local_398;
        boost::unordered::detail::foa::
        table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
        ::erase<false,_nullptr>
                  ((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                    *)&currState,pos);
        return;
      }
    }
    lVar9 = uVar18 + lVar17;
    lVar17 = lVar17 + 1;
    uVar18 = lVar9 + 1U &
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .arrays.groups_size_mask;
  } while( true );
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }